

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Performance::ShaderCompilerCase::compileShader
          (ShaderCompilerCase *this,deUint32 shader)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  int local_24;
  long lStack_20;
  GLint status;
  Functions *gl;
  ShaderCompilerCase *pSStack_10;
  deUint32 shader_local;
  ShaderCompilerCase *this_local;
  
  gl._4_4_ = shader;
  pSStack_10 = this;
  pRVar2 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_24 = 0;
  (**(code **)(lStack_20 + 0x248))(gl._4_4_);
  (**(code **)(lStack_20 + 0xa70))(gl._4_4_,0x8b81,&local_24);
  return local_24 != 0;
}

Assistant:

bool ShaderCompilerCase::compileShader (deUint32 shader) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();
	GLint status = 0;
	gl.compileShader(shader);
	gl.getShaderiv(shader, GL_COMPILE_STATUS, &status);
	return status != 0;
}